

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode deleteReference(UA_Server *server,UA_Session *session,UA_DeleteReferencesItem *item)

{
  UA_StatusCode UVar1;
  UA_NodeId local_98;
  undefined8 local_80;
  size_t sStack_78;
  UA_Byte *local_70;
  ulong local_68;
  undefined8 uStack_60;
  size_t local_58;
  UA_Byte *pUStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  UVar1 = UA_Server_editNode(server,session,&item->sourceNodeId,deleteOneWayReference,item);
  if (((UVar1 == 0) && (UVar1 = 0, item->deleteBidirectional == true)) &&
     ((item->targetNodeId).serverIndex == 0)) {
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_68 = (ulong)item->isForward ^ 1;
    local_98.identifier.string.data = (item->targetNodeId).nodeId.identifier.string.data;
    local_98.namespaceIndex = (item->targetNodeId).nodeId.namespaceIndex;
    local_98._2_2_ = *(undefined2 *)&(item->targetNodeId).nodeId.field_0x2;
    local_98.identifierType = (item->targetNodeId).nodeId.identifierType;
    local_98.identifier.string.length = (item->targetNodeId).nodeId.identifier.string.length;
    uStack_60._0_2_ = (item->sourceNodeId).namespaceIndex;
    uStack_60._2_2_ = *(undefined2 *)&(item->sourceNodeId).field_0x2;
    uStack_60._4_4_ = (item->sourceNodeId).identifierType;
    local_58 = (item->sourceNodeId).identifier.string.length;
    pUStack_50 = (item->sourceNodeId).identifier.string.data;
    local_80._0_2_ = (item->referenceTypeId).namespaceIndex;
    local_80._2_2_ = *(undefined2 *)&(item->referenceTypeId).field_0x2;
    local_80._4_4_ = (item->referenceTypeId).identifierType;
    sStack_78 = (item->referenceTypeId).identifier.string.length;
    local_70 = (item->referenceTypeId).identifier.string.data;
    UVar1 = UA_Server_editNode(server,session,&local_98,deleteOneWayReference,&local_98);
  }
  return UVar1;
}

Assistant:

static UA_StatusCode
deleteReference(UA_Server *server, UA_Session *session,
                const UA_DeleteReferencesItem *item) {
    UA_StatusCode retval = UA_Server_editNode(server, session, &item->sourceNodeId,
                                              (UA_EditNodeCallback)deleteOneWayReference, item);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;
    if(!item->deleteBidirectional || item->targetNodeId.serverIndex != 0)
        return retval;
    UA_DeleteReferencesItem secondItem;
    UA_DeleteReferencesItem_init(&secondItem);
    secondItem.isForward = !item->isForward;
    secondItem.sourceNodeId = item->targetNodeId.nodeId;
    secondItem.targetNodeId.nodeId = item->sourceNodeId;
    secondItem.referenceTypeId = item->referenceTypeId;
    return UA_Server_editNode(server, session, &secondItem.sourceNodeId,
                              (UA_EditNodeCallback)deleteOneWayReference, &secondItem);
}